

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

VMFunction * PClass::FindFunction(FName *clsname,FName *funcname)

{
  PClassActor *pPVar1;
  DObject *p;
  PFunction *pPVar2;
  FName local_10;
  FName local_c;
  
  local_c = (FName)clsname->Index;
  pPVar1 = FindActor(&local_c);
  if (pPVar1 != (PClassActor *)0x0) {
    local_10 = (FName)funcname->Index;
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar1->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                    super_PCompoundType.super_PType.Symbols,&local_10,true);
    pPVar2 = dyn_cast<PFunction>(p);
    if (pPVar2 != (PFunction *)0x0) {
      return ((pPVar2->Variants).Array)->Implementation;
    }
  }
  return (VMFunction *)0x0;
}

Assistant:

VMFunction *PClass::FindFunction(FName clsname, FName funcname)
{
	auto cls = PClass::FindActor(clsname);
	if (!cls) return nullptr;
	auto func = dyn_cast<PFunction>(cls->Symbols.FindSymbol(funcname, true));
	if (!func) return nullptr;
	return func->Variants[0].Implementation;
}